

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar1 = *(long *)this;
  if (*(long *)(this + 8) != lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      Type::GetName((Type *)(lVar1 + lVar2));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (uVar3 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
      lVar1 = *(long *)this;
      lVar2 = lVar2 + 4;
    } while (uVar3 < (ulong)(*(long *)(this + 8) - lVar1 >> 2));
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += types[i].GetName();
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}